

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfl_avx2.c
# Opt level: O2

void cfl_predict_lbd_avx2
               (int16_t *pred_buf_q3,uint8_t *dst,int dst_stride,int alpha_q3,int width,int height)

{
  byte bVar1;
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 (*pauVar5) [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  
  auVar6._0_2_ = (undefined2)alpha_q3;
  auVar6._2_2_ = auVar6._0_2_;
  auVar6._4_2_ = auVar6._0_2_;
  auVar6._6_2_ = auVar6._0_2_;
  auVar6._8_2_ = auVar6._0_2_;
  auVar6._10_2_ = auVar6._0_2_;
  auVar6._12_2_ = auVar6._0_2_;
  auVar6._14_2_ = auVar6._0_2_;
  auVar6._16_2_ = auVar6._0_2_;
  auVar6._18_2_ = auVar6._0_2_;
  auVar6._20_2_ = auVar6._0_2_;
  auVar6._22_2_ = auVar6._0_2_;
  auVar6._24_2_ = auVar6._0_2_;
  auVar6._26_2_ = auVar6._0_2_;
  auVar6._28_2_ = auVar6._0_2_;
  auVar6._30_2_ = auVar6._0_2_;
  auVar7 = vpabsw_avx2(auVar6);
  auVar7 = vpsllw_avx2(auVar7,9);
  bVar1 = *dst;
  auVar8[1] = 0;
  auVar8[0] = bVar1;
  auVar8[2] = bVar1;
  auVar8[3] = 0;
  auVar8[4] = bVar1;
  auVar8[5] = 0;
  auVar8[6] = bVar1;
  auVar8[7] = 0;
  auVar8[8] = bVar1;
  auVar8[9] = 0;
  auVar8[10] = bVar1;
  auVar8[0xb] = 0;
  auVar8[0xc] = bVar1;
  auVar8[0xd] = 0;
  auVar8[0xe] = bVar1;
  auVar8[0xf] = 0;
  auVar8[0x10] = bVar1;
  auVar8[0x11] = 0;
  auVar8[0x12] = bVar1;
  auVar8[0x13] = 0;
  auVar8[0x14] = bVar1;
  auVar8[0x15] = 0;
  auVar8[0x16] = bVar1;
  auVar8[0x17] = 0;
  auVar8[0x18] = bVar1;
  auVar8[0x19] = 0;
  auVar8[0x1a] = bVar1;
  auVar8[0x1b] = 0;
  auVar8[0x1c] = bVar1;
  auVar8[0x1d] = 0;
  auVar8[0x1e] = bVar1;
  auVar8[0x1f] = 0;
  pauVar5 = (undefined1 (*) [32])(pred_buf_q3 + (ulong)(uint)(width * 2) * 0x10);
  do {
    auVar3 = vpsignw_avx2(auVar6,*(undefined1 (*) [32])pred_buf_q3);
    auVar2 = vpabsw_avx2(*(undefined1 (*) [32])pred_buf_q3);
    auVar2 = vpmulhrsw_avx2(auVar2,auVar7);
    auVar2 = vpsignw_avx2(auVar2,auVar3);
    auVar3 = vpaddw_avx2(auVar2,auVar8);
    auVar4 = vpsignw_avx2(auVar6,*(undefined1 (*) [32])((long)pred_buf_q3 + 0x20));
    auVar2 = vpabsw_avx2(*(undefined1 (*) [32])((long)pred_buf_q3 + 0x20));
    auVar2 = vpmulhrsw_avx2(auVar2,auVar7);
    auVar2 = vpsignw_avx2(auVar2,auVar4);
    auVar2 = vpaddw_avx2(auVar2,auVar8);
    auVar2 = vpackuswb_avx2(auVar3,auVar2);
    auVar2 = vpermq_avx2(auVar2,0xd8);
    *(undefined1 (*) [32])dst = auVar2;
    dst = *(undefined1 (*) [32])dst + dst_stride;
    pred_buf_q3 = (int16_t *)((long)pred_buf_q3 + 0x40);
  } while (pred_buf_q3 < pauVar5);
  return;
}

Assistant:

static inline void cfl_predict_lbd_avx2(const int16_t *pred_buf_q3,
                                        uint8_t *dst, int dst_stride,
                                        int alpha_q3, int width, int height) {
  (void)width;
  const __m256i alpha_sign = _mm256_set1_epi16(alpha_q3);
  const __m256i alpha_q12 = _mm256_slli_epi16(_mm256_abs_epi16(alpha_sign), 9);
  const __m256i dc_q0 = _mm256_set1_epi16(*dst);
  __m256i *row = (__m256i *)pred_buf_q3;
  const __m256i *row_end = row + height * CFL_BUF_LINE_I256;

  do {
    __m256i res = predict_unclipped(row, alpha_q12, alpha_sign, dc_q0);
    __m256i next = predict_unclipped(row + 1, alpha_q12, alpha_sign, dc_q0);
    res = _mm256_packus_epi16(res, next);
    res = _mm256_permute4x64_epi64(res, _MM_SHUFFLE(3, 1, 2, 0));
    _mm256_storeu_si256((__m256i *)dst, res);
    dst += dst_stride;
  } while ((row += CFL_BUF_LINE_I256) < row_end);
}